

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xoshiro256plus.hpp
# Opt level: O3

void __thiscall trng::xoshiro256plus::jump(xoshiro256plus *this,unsigned_long_long s)

{
  int j_1;
  ulong uVar1;
  undefined1 *__s;
  ulong uVar2;
  undefined1 *m;
  void *pvVar3;
  int j;
  ulong uVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  result_type rVar9;
  int i;
  anon_class_16_2_94731e0a f;
  vector<trng::GF2,_256UL> v0;
  vector<trng::GF2,_256UL> v1;
  xoshiro256plus local_b8;
  undefined1 *local_90;
  matrix<trng::GF2,_256UL> *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  status_type local_68;
  matrix<trng::GF2,_256UL> local_48;
  
  if (s < 0x10) {
    if (s != 0) {
      uVar1 = (this->S).r[0];
      rVar9 = (this->S).r[1];
      uVar4 = (this->S).r[2];
      uVar2 = (this->S).r[3];
      uVar7 = 0;
      do {
        uVar8 = rVar9 << 0x11;
        uVar4 = uVar4 ^ uVar1;
        uVar2 = uVar2 ^ rVar9;
        rVar9 = rVar9 ^ uVar4;
        uVar1 = uVar1 ^ uVar2;
        uVar4 = uVar4 ^ uVar8;
        uVar2 = uVar2 << 0x2d | uVar2 >> 0x13;
        uVar7 = uVar7 + 1;
      } while (uVar7 < (uint)s);
      (this->S).r[1] = rVar9;
      (this->S).r[2] = uVar4;
      (this->S).r[3] = uVar2;
      (this->S).r[0] = uVar1;
    }
  }
  else {
    local_88 = (matrix<trng::GF2,_256UL> *)s;
    __s = (undefined1 *)operator_new(0x10000);
    uVar1 = 0;
    local_80 = __s;
    local_70 = __s + 0x10000;
    memset(__s,0,0x10000);
    local_90 = __s;
    local_78 = __s + 0x10000;
    do {
      xoshiro256plus(&local_b8);
      status_type::status_type(&local_68,uVar1 & 0xffffffff);
      local_b8.S.r[1] = local_68.r[2] ^ local_68.r[0] ^ local_68.r[1];
      uVar4 = local_68.r[1] ^ local_68.r[3];
      local_b8.S.r[0] = local_68.r[0] ^ uVar4;
      local_b8.S.r[2] = local_68.r[2] ^ local_68.r[0] ^ local_68.r[1] << 0x11;
      local_b8.S.r[3] = uVar4 << 0x2d | uVar4 >> 0x13;
      status_type::to_vector((vector<trng::GF2,_256UL> *)&local_68,&local_b8.S);
      lVar5 = 0;
      m = __s;
      do {
        *m = *(undefined1 *)(local_68.r[0] + lVar5);
        lVar5 = lVar5 + 1;
        m = m + 0x100;
      } while (lVar5 != 0x100);
      if ((void *)local_68.r[0] != (void *)0x0) {
        operator_delete((void *)local_68.r[0]);
      }
      uVar1 = uVar1 + 1;
      __s = __s + 1;
    } while (uVar1 != 0x100);
    status_type::to_vector((vector<trng::GF2,_256UL> *)&local_b8,&this->S);
    power<trng::GF2,256ul>(&local_48,(trng *)&local_80,local_88,(unsigned_long_long)m);
    f.b = (vector<trng::GF2,_256UL> *)&local_b8;
    f.a = &local_48;
    vector<trng::GF2,256ul>::operator*((vector<trng::GF2,256ul> *)&local_68,f);
    if (local_48.data.super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.data.super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    lVar5 = 0;
    pvVar3 = (void *)local_68.r[0];
    do {
      lVar6 = 0;
      rVar9 = 0;
      do {
        rVar9 = (ulong)(*(char *)((long)pvVar3 + lVar6) != '\0') + rVar9 * 2;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0x40);
      (this->S).r[lVar5] = rVar9;
      lVar5 = lVar5 + 1;
      pvVar3 = (void *)((long)pvVar3 + 0x40);
    } while (lVar5 != 4);
    operator_delete((void *)local_68.r[0]);
    if ((void *)local_b8.S.r[0] != (void *)0x0) {
      operator_delete((void *)local_b8.S.r[0]);
    }
    if (local_80 != (undefined1 *)0x0) {
      operator_delete(local_80);
    }
  }
  return;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void xoshiro256plus::jump(unsigned long long s) {
    if (s < 16) {
      for (unsigned int i{0}; i < s; ++i)
        step();
    } else {
      matrix<GF2, 256> M;
      for (int i{0}; i < 256; ++i) {
        xoshiro256plus R;
        R.S = status_type(i, status_type::eye{});
        R.step();
        const vector<GF2, 256> v{R.S.to_vector()};
        for (int j{0}; j < 256; ++j)
          M(j, i) = v(j);
      }

      const vector<GF2, 256> v0{S.to_vector()};
      const vector<GF2, 256> v1{power(M, s) * v0};

      for (int j{0}; j < 4; ++j) {
        result_type r_j{0};
        for (int i{0}; i < 64; ++i) {
          r_j <<= 1;
          if (static_cast<bool>(v1(i + 64 * j)))
            r_j |= 1;
        }
        S.r[j] = r_j;
      }
    }
  }